

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O0

wchar_t * ON_Environment::StringFromProjection(BackgroundProjections proj)

{
  wchar_t *pwStack_10;
  BackgroundProjections proj_local;
  
  switch(proj) {
  case Planar:
    pwStack_10 = L"planar";
    break;
  case Spherical:
    pwStack_10 = L"spherical";
    break;
  case Emap:
    pwStack_10 = L"emap";
    break;
  case Box:
    pwStack_10 = L"box";
    break;
  default:
    ON_REMOVE_ASAP_AssertEx
              (0,
               "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_render_content.cpp"
               ,0xd5,"","false is false");
    pwStack_10 = L"planar";
    break;
  case LightProbe:
    pwStack_10 = L"lightprobe";
    break;
  case CubeMap:
    pwStack_10 = L"cubemap";
    break;
  case VerticalCrossCubeMap:
    pwStack_10 = L"vertical-cross-cubemap";
    break;
  case HorizontalCrossCubeMap:
    pwStack_10 = L"horizontal-cross-cubemap";
    break;
  case Hemispherical:
    pwStack_10 = L"hemispherical";
  }
  return pwStack_10;
}

Assistant:

const wchar_t* ON_Environment::StringFromProjection(BackgroundProjections proj) // Static.
{
  switch (proj)
  {
  case BackgroundProjections::Planar:                 return ON_ENVIRONMENT_PROJECTION_PLANAR;
  case BackgroundProjections::Spherical:              return ON_ENVIRONMENT_PROJECTION_SPHERICAL;
  case BackgroundProjections::Emap:                   return ON_ENVIRONMENT_PROJECTION_EMAP;
  case BackgroundProjections::Box:                    return ON_ENVIRONMENT_PROJECTION_BOX;
  case BackgroundProjections::LightProbe:             return ON_ENVIRONMENT_PROJECTION_LIGHT_PROBE;
  case BackgroundProjections::CubeMap:                return ON_ENVIRONMENT_PROJECTION_CUBE_MAP;
  case BackgroundProjections::VerticalCrossCubeMap:   return ON_ENVIRONMENT_PROJECTION_CUBE_MAP_VERT;
  case BackgroundProjections::HorizontalCrossCubeMap: return ON_ENVIRONMENT_PROJECTION_CUBE_MAP_HORZ;
  case BackgroundProjections::Hemispherical:          return ON_ENVIRONMENT_PROJECTION_HEMISPHERICAL;
  default: break;
  }

  ON_ASSERT(false);
  return ON_ENVIRONMENT_PROJECTION_PLANAR;
}